

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O1

void dgrminer::printResultsToFiles
               (results_crate *results,results_crate_anomalies *results_anomalies,PartialUnion *pu,
               string *output_file,bool set_of_graphs,bool compute_confidence,
               bool search_for_anomalies,bool append_to_file)

{
  pointer pcVar1;
  pointer pvVar2;
  pointer paVar3;
  pointer paVar4;
  pointer puVar5;
  char cVar6;
  pointer pdVar7;
  pointer piVar8;
  char cVar9;
  int j;
  long lVar10;
  results_crate_anomalies *prVar11;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  long lVar12;
  int j_1;
  ulong uVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream myfile;
  undefined1 *local_490 [2];
  undefined1 local_480 [16];
  results_crate_anomalies *local_470;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_468;
  undefined4 local_45c;
  PartialUnion *local_458;
  string local_450;
  undefined1 *local_430;
  filebuf local_428 [8];
  undefined1 local_420 [232];
  ios_base local_338 [264];
  undefined1 *local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_45c = CONCAT31(in_register_00000081,set_of_graphs);
  local_458 = pu;
  std::ofstream::ofstream((ostream *)&local_230);
  local_430 = local_420;
  if (append_to_file) {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
  }
  else {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"pattern,id,label_int,changetime",0x1f);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  local_468 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)CONCAT44(local_468._4_4_,CONCAT31(in_register_00000089,compute_confidence));
  local_470 = results_anomalies;
  if ((results->result_nodes).
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (results->result_nodes).
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      lVar10 = 0;
      do {
        std::ostream::operator<<
                  ((ostream *)&local_230,
                   *(int *)((long)((results->result_nodes).
                                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                           lVar10 * 4 + lVar12));
        if (lVar10 != 3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      cVar9 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar9);
      std::ostream::put(cVar9);
      std::ostream::flush();
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar13 < (ulong)((long)(results->result_nodes).
                                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(results->result_nodes).
                                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::ofstream::close();
  local_430 = local_420;
  if (append_to_file) {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
  }
  else {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"pattern,src,dst,label_int,direction,edgetime",0x2c);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  if ((results->result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (results->result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      lVar10 = -6;
      do {
        std::ostream::operator<<
                  ((ostream *)&local_230,
                   *(int *)((long)(results->result_edges).
                                  super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_elems +
                           lVar10 * 4 + lVar12));
        if (lVar10 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0);
      cVar9 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar9);
      std::ostream::put(cVar9);
      std::ostream::flush();
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar13 < (ulong)(((long)(results->result_edges).
                                     super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(results->result_edges).
                                     super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  std::ofstream::close();
  cVar9 = (char)local_468;
  local_430 = local_420;
  if (append_to_file) {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
  }
  else {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"support_absolute,support_relative",0x21);
    if (cVar9 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",confidence",0xb);
    }
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  if ((results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
      std::ostream::_M_insert<double>
                ((results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13]);
      if (cVar9 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
        std::ostream::_M_insert<double>
                  ((results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar13]);
      }
      cVar6 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)(results->support_absolute).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(results->support_absolute).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ofstream::close();
  local_430 = local_420;
  if (append_to_file) {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
  }
  else {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_430,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_430);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_430);
    if (local_430 != local_420) {
      operator_delete(local_430);
    }
    if ((char)local_45c == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"graph_snapshots",0xf);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"graphs",6);
    }
    std::ios::widen((char)(string *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  local_468 = &results->occurrences;
  if ((results->occurrences).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (results->occurrences).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      pvVar2 = (local_468->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar8 = pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) != piVar8) {
        uVar14 = 0;
        do {
          std::ostream::operator<<((ostream *)&local_230,piVar8[uVar14] + 1);
          pvVar2 = (local_468->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (uVar14 < ((long)*(pointer *)
                               ((long)&pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) -
                        *(long *)&pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data >> 2) - 1U) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
          }
          uVar14 = uVar14 + 1;
          pvVar2 = (local_468->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar8 = pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[uVar13].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 8) - (long)piVar8
                                 >> 2));
      }
      cVar9 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar9);
      std::ostream::put(cVar9);
      std::ostream::flush();
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)(((long)(results->occurrences).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(results->occurrences).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  std::ofstream::close();
  prVar11 = local_470;
  if (search_for_anomalies) {
    std::ofstream::ofstream((ostream *)&local_430);
    local_490[0] = local_480;
    if (append_to_file) {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
    }
    else {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_430,"anomaly_pattern,id,label_int,changetime",0x27);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    if ((prVar11->anomaly_result_nodes).
        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (prVar11->anomaly_result_nodes).
        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar12 = 0;
      uVar13 = 0;
      do {
        lVar10 = 0;
        do {
          std::ostream::operator<<
                    ((ostream *)&local_430,
                     *(int *)((long)((local_470->anomaly_result_nodes).
                                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                             lVar10 * 4 + lVar12));
          if (lVar10 != 3) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,",",1);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        cVar9 = (char)(ostream *)&local_430;
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar13 < (ulong)((long)(local_470->anomaly_result_nodes).
                                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_470->anomaly_result_nodes).
                                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::ofstream::close();
    prVar11 = local_470;
    local_490[0] = local_480;
    if (append_to_file) {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
    }
    else {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_430,"anomaly_pattern,src,dst,label_int,direction,edgetime",0x34);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    if ((prVar11->anomaly_result_edges).
        super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (prVar11->anomaly_result_edges).
        super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar12 = 0;
      uVar13 = 0;
      do {
        lVar10 = -6;
        do {
          std::ostream::operator<<
                    ((ostream *)&local_430,
                     *(int *)((long)(local_470->anomaly_result_edges).
                                    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1]._M_elems +
                             lVar10 * 4 + lVar12));
          if (lVar10 != -1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,",",1);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
        cVar9 = (char)(ostream *)&local_430;
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x18;
      } while (uVar13 < (ulong)(((long)(local_470->anomaly_result_edges).
                                       super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_470->anomaly_result_edges).
                                       super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    std::ofstream::close();
    prVar11 = local_470;
    local_490[0] = local_480;
    if (append_to_file) {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
    }
    else {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_430,"anomaly_pattern,pattern",0x17);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    piVar8 = (prVar11->anomaly_id_of_anomalous_pattern).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((prVar11->anomaly_id_of_anomalous_pattern).super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish != piVar8) {
      uVar13 = 0;
      do {
        std::ostream::operator<<((ostream *)&local_430,piVar8[uVar13]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,",",1);
        std::ostream::operator<<
                  ((ostream *)&local_430,
                   (prVar11->anomaly_id_of_explanation_pattern).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar13]);
        cVar9 = (char)(ostream *)&local_430;
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
        uVar13 = uVar13 + 1;
        piVar8 = (prVar11->anomaly_id_of_anomalous_pattern).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
      } while (uVar13 < (ulong)((long)(prVar11->anomaly_id_of_anomalous_pattern).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar8 >> 2));
    }
    std::ofstream::close();
    if (append_to_file) {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      local_490[0] = local_480;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
    }
    else {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      local_490[0] = local_480;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"outlierness",0xb);
      std::ios::widen((char)(ostream *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    pdVar7 = (prVar11->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((prVar11->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar7) {
      uVar13 = 0;
      do {
        std::ostream::_M_insert<double>(pdVar7[uVar13]);
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + (char)&local_430);
        std::ostream::put((char)&local_430);
        std::ostream::flush();
        uVar13 = uVar13 + 1;
        pdVar7 = (prVar11->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)((long)(prVar11->anomaly_outlierness).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar7 >> 3));
    }
    std::ofstream::close();
    if (append_to_file) {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      local_490[0] = local_480;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
    }
    else {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      local_490[0] = local_480;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_490,pcVar1,pcVar1 + output_file->_M_string_length);
      std::__cxx11::string::append((char *)local_490);
      std::ofstream::open((string *)&local_430,(_Ios_Openmode)local_490);
      if (local_490[0] != local_480) {
        operator_delete(local_490[0]);
      }
      if ((char)local_45c == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_430,"graph_snapshots",0xf);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"graphs",6);
      }
      std::ios::widen((char)(string *)&local_430 + (char)*(undefined8 *)(local_430 + -0x18));
      std::ostream::put((char)&local_430);
      std::ostream::flush();
    }
    if ((prVar11->anomaly_occurrences).
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (prVar11->anomaly_occurrences).
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        pvVar2 = (prVar11->anomaly_occurrences).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar8 = pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data + 8) != piVar8) {
          uVar14 = 0;
          do {
            std::ostream::operator<<((ostream *)&local_430,piVar8[uVar14] + 1);
            pvVar2 = (local_470->anomaly_occurrences).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (uVar14 < ((long)*(pointer *)
                                 ((long)&pvVar2[uVar13].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + 8) -
                          *(long *)&pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data >> 2) - 1U) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,",",1);
            }
            uVar14 = uVar14 + 1;
            pvVar2 = (local_470->anomaly_occurrences).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar8 = pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar14 < (ulong)((long)*(pointer *)
                                           ((long)&pvVar2[uVar13].
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data + 8) -
                                    (long)piVar8 >> 2));
        }
        cVar9 = (char)(ostream *)&local_430;
        std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
        uVar13 = uVar13 + 1;
        prVar11 = local_470;
      } while (uVar13 < (ulong)(((long)(local_470->anomaly_occurrences).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_470->anomaly_occurrences).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    std::ofstream::close();
    local_430 = _VTT;
    *(undefined8 *)(local_428 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_428);
    std::ios_base::~ios_base(local_338);
  }
  if (!append_to_file) {
    pcVar1 = (output_file->_M_dataplus)._M_p;
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_450,pcVar1,pcVar1 + output_file->_M_string_length);
    std::__cxx11::string::append((char *)&local_450);
    PartialUnion::outputEncodingToFile(local_458,&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
  }
  paVar3 = (results->result_nodes).
           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->result_nodes).
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar3) {
    (results->result_nodes).
    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar3;
  }
  paVar4 = (results->result_edges).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar4) {
    (results->result_edges).
    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar4;
  }
  puVar5 = (results->support_absolute).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar5) {
    (results->support_absolute).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar5;
  }
  pdVar7 = (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar7) {
    (results->support).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar7;
  }
  pdVar7 = (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar7) {
    (results->confidence).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar7;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(local_468);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&results->occurrences_antecedent);
  if (search_for_anomalies) {
    paVar3 = (prVar11->anomaly_result_nodes).
             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((prVar11->anomaly_result_nodes).
        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish != paVar3) {
      (prVar11->anomaly_result_nodes).
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar3;
    }
    paVar4 = (prVar11->anomaly_result_edges).
             super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((prVar11->anomaly_result_edges).
        super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish != paVar4) {
      (prVar11->anomaly_result_edges).
      super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar4;
    }
    piVar8 = (prVar11->anomaly_id_of_anomalous_pattern).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((prVar11->anomaly_id_of_anomalous_pattern).super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish != piVar8) {
      (prVar11->anomaly_id_of_anomalous_pattern).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish = piVar8;
    }
    piVar8 = (prVar11->anomaly_id_of_explanation_pattern).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((prVar11->anomaly_id_of_explanation_pattern).super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish != piVar8) {
      (prVar11->anomaly_id_of_explanation_pattern).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish = piVar8;
    }
    pdVar7 = (prVar11->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((prVar11->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar7) {
      (prVar11->anomaly_outlierness).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar7;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&prVar11->anomaly_occurrences);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void printResultsToFiles(results_crate * results, results_crate_anomalies * results_anomalies, PartialUnion pu, std::string output_file, bool set_of_graphs,
		bool compute_confidence, bool search_for_anomalies, bool append_to_file)
	{
		// NODES
		ofstream myfile;
		if (append_to_file) {
			myfile.open(output_file + "_nodes", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_nodes");
			myfile << "pattern,id,label_int,changetime" << endl;
		}
		for (size_t i = 0; i < results->result_nodes.size(); i++)
		{
			for (int j = 0; j < 4; j++)
			{
				myfile << results->result_nodes[i][j];
				if (j < 3) {
					myfile << ",";
				}
			}
			myfile << endl;
		}
		myfile.close();

		// EDGES
		if (append_to_file) {
			myfile.open(output_file + "_edges", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_edges");
			myfile << "pattern,src,dst,label_int,direction,edgetime" << endl;
		}
		for (size_t i = 0; i < results->result_edges.size(); i++)
		{
			for (int j = 0; j < 6; j++)
			{
				myfile << results->result_edges[i][j];
				if (j < 5) {
					myfile << ",";
				}
			}
			myfile << endl;
		}
		myfile.close();

		// MEASURES
		if (append_to_file) {
			myfile.open(output_file + "_measures", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_measures");
			myfile << "support_absolute,support_relative";
			if (compute_confidence)
			{
				myfile << ",confidence";
			}
			myfile << endl;
		}
		for (size_t i = 0; i < results->support_absolute.size(); i++)
		{
			myfile << results->support_absolute[i];
			myfile << "," << results->support[i];
			if (compute_confidence)
			{
				myfile << "," << results->confidence[i];
			}
			myfile << endl;
		}
		myfile.close();

		// index snapshots from 1

		// OCCURRENCES
		if (append_to_file) {
			myfile.open(output_file + "_occurrences", std::ios_base::app);
		}
		else {
			myfile.open(output_file + "_occurrences");
			if (set_of_graphs)
			{
				myfile << "graphs" << endl;
			}
			else
			{
				myfile << "graph_snapshots" << endl;
			}
		}
		for (size_t i = 0; i < results->occurrences.size(); i++)
		{

			for (int j = 0; j < results->occurrences[i].size(); j++)
			{
				myfile << (results->occurrences[i][j] + 1);
				if (j < results->occurrences[i].size() - 1) {
					myfile << ",";
				}
			}

			myfile << endl;
		}
		myfile.close();



		// print anomalies:
		if (search_for_anomalies)
		{
			// NODES
			ofstream myfile;
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_nodes", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_nodes");
				myfile << "anomaly_pattern,id,label_int,changetime" << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_result_nodes.size(); i++)
			{
				for (int j = 0; j < 4; j++)
				{
					myfile << results_anomalies->anomaly_result_nodes[i][j];
					if (j < 3) {
						myfile << ",";
					}
				}
				myfile << endl;
			}
			myfile.close();

			// EDGES
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_edges", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_edges");
				myfile << "anomaly_pattern,src,dst,label_int,direction,edgetime" << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_result_edges.size(); i++)
			{
				for (int j = 0; j < 6; j++)
				{
					myfile << results_anomalies->anomaly_result_edges[i][j];
					if (j < 5) {
						myfile << ",";
					}
				}
				myfile << endl;
			}
			myfile.close();

			// LINKING TO FREQUENT PATTERNS
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_explanation", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_explanation");
				myfile << "anomaly_pattern,pattern";
				myfile << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_id_of_anomalous_pattern.size(); i++)
			{
				myfile << results_anomalies->anomaly_id_of_anomalous_pattern[i];
				myfile << "," << results_anomalies->anomaly_id_of_explanation_pattern[i];
				myfile << endl;
			}
			myfile.close();

			// ANOMALY OUTLIERNESS
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_outlierness", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_outlierness");
				myfile << "outlierness";
				myfile << endl;
			}
			for (size_t i = 0; i < results_anomalies->anomaly_outlierness.size(); i++)
			{
				myfile << results_anomalies->anomaly_outlierness[i];
				myfile << endl;
			}
			myfile.close();

			// index snapshots from 1

			// OCCURRENCES
			if (append_to_file) {
				myfile.open(output_file + "_anomalies_occurrences", std::ios_base::app);
			}
			else {
				myfile.open(output_file + "_anomalies_occurrences");
				if (set_of_graphs)
				{
					myfile << "graphs" << endl;
				}
				else
				{
					myfile << "graph_snapshots" << endl;
				}
			}
			for (size_t i = 0; i < results_anomalies->anomaly_occurrences.size(); i++)
			{

				for (int j = 0; j < results_anomalies->anomaly_occurrences[i].size(); j++)
				{
					myfile << (results_anomalies->anomaly_occurrences[i][j] + 1);
					if (j < results_anomalies->anomaly_occurrences[i].size() - 1) {
						myfile << ",";
					}
				}

				myfile << endl;
			}
			myfile.close();
		}

		if (!append_to_file) {
			pu.outputEncodingToFile(output_file + "_encoding");
		}

		results->result_nodes.clear();
		results->result_edges.clear();
		results->support_absolute.clear();
		results->support.clear();
		results->confidence.clear();
		results->occurrences.clear();
		results->occurrences_antecedent.clear();

		if (search_for_anomalies)
		{
			results_anomalies->anomaly_result_nodes.clear();
			results_anomalies->anomaly_result_edges.clear();
			results_anomalies->anomaly_id_of_anomalous_pattern.clear();
			results_anomalies->anomaly_id_of_explanation_pattern.clear();
			results_anomalies->anomaly_outlierness.clear();
			results_anomalies->anomaly_occurrences.clear();
		}
	}